

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
 __thiscall
so_5::details::
make_message_instance_impl<false,so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>::
make<so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>>,int_const&>
          (make_message_instance_impl<false,so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
           *this,outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
                 *args,int *args_1)

{
  next_turn *this_00;
  outliving_reference_t<so_5::stats::impl::st_env_stuff::next_turn_handler_t> local_28;
  int *local_20;
  int *args_local_1;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
  *args_local;
  
  local_20 = args_1;
  args_local_1 = (int *)args;
  args_local = (outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
                *)this;
  ensure_not_signal<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>();
  this_00 = (next_turn *)operator_new(0x28);
  outliving_reference_t<so_5::stats::impl::st_env_stuff::next_turn_handler_t>::
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>>
            (&local_28,
             (outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
              *)args_local_1);
  stats::impl::st_env_stuff::next_turn_handler_t::next_turn::next_turn(this_00,&local_28,*local_20);
  std::
  unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>>
  ::
  unique_ptr<std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>,void>
            ((unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>>
              *)this,this_00);
  return (__uniq_ptr_data<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>,_true,_true>
          )(__uniq_ptr_data<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}